

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToUni::map_str(CCharmapToUni *this,char *outbuf,size_t outbuflen,char *input_str)

{
  size_t sVar1;
  size_t sVar2;
  char *in_RCX;
  long in_RDX;
  undefined1 *in_RSI;
  long *in_RDI;
  size_t output_len;
  long local_18;
  undefined1 *local_10 [2];
  
  local_18 = in_RDX;
  local_10[0] = in_RSI;
  sVar1 = strlen(in_RCX);
  sVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_10,&local_18,in_RCX,sVar1);
  if (local_18 != 0) {
    *local_10[0] = 0;
  }
  return sVar2;
}

Assistant:

size_t CCharmapToUni::map_str(char *outbuf, size_t outbuflen,
                              const char *input_str)
{
    /* map the string to the output buffer */
    size_t output_len = map(&outbuf, &outbuflen, input_str, strlen(input_str));

    /* if there's space remaining in the output buffer, add a null byte */
    if (outbuflen != 0)
        *outbuf = '\0';

    /* return the number of bytes needed for the conversion */
    return output_len;
}